

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btInternalEdgeUtility.cpp
# Opt level: O3

bool btClampNormal(btVector3 *edge,btVector3 *tri_normal_org,btVector3 *localContactNormalOnB,
                  btScalar correctedEdgeAngle,btVector3 *clampedLocalNormal)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  btQuaternion local_58;
  btMatrix3x3 local_48;
  
  fVar6 = tri_normal_org->m_floats[0];
  fVar1 = tri_normal_org->m_floats[1];
  fVar2 = tri_normal_org->m_floats[2];
  fVar8 = edge->m_floats[1] * fVar2 - fVar1 * edge->m_floats[2];
  fVar9 = edge->m_floats[2] * fVar6 - fVar2 * edge->m_floats[0];
  fVar7 = edge->m_floats[0] * fVar1 - fVar6 * edge->m_floats[1];
  fVar5 = 1.0 / SQRT(fVar7 * fVar7 + fVar8 * fVar8 + fVar9 * fVar9);
  fVar6 = atan2f(fVar5 * fVar7 * localContactNormalOnB->m_floats[2] +
                 fVar8 * fVar5 * localContactNormalOnB->m_floats[0] +
                 fVar9 * fVar5 * localContactNormalOnB->m_floats[1],
                 localContactNormalOnB->m_floats[2] * fVar2 +
                 localContactNormalOnB->m_floats[0] * fVar6 +
                 fVar1 * localContactNormalOnB->m_floats[1]);
  if ((0.0 <= correctedEdgeAngle) || (correctedEdgeAngle <= fVar6)) {
    if (correctedEdgeAngle < 0.0) {
      return false;
    }
    if (fVar6 <= correctedEdgeAngle) {
      return false;
    }
  }
  fVar1 = edge->m_floats[0];
  fVar2 = edge->m_floats[1];
  fVar5 = edge->m_floats[2];
  fVar8 = (correctedEdgeAngle - fVar6) * 0.5;
  fVar7 = sinf(fVar8);
  fVar7 = fVar7 / SQRT(fVar5 * fVar5 + fVar1 * fVar1 + fVar2 * fVar2);
  fVar6 = edge->m_floats[2];
  uVar3 = *(undefined8 *)edge->m_floats;
  local_58.super_btQuadWord.m_floats[3] = cosf(fVar8);
  local_58.super_btQuadWord.m_floats[1] = fVar7 * (float)((ulong)uVar3 >> 0x20);
  local_58.super_btQuadWord.m_floats[0] = fVar7 * (float)uVar3;
  local_58.super_btQuadWord.m_floats[2] = fVar6 * fVar7;
  btMatrix3x3::setRotation(&local_48,&local_58);
  fVar6 = localContactNormalOnB->m_floats[0];
  fVar1 = localContactNormalOnB->m_floats[1];
  fVar2 = localContactNormalOnB->m_floats[2];
  auVar4._4_4_ = fVar2 * local_48.m_el[1].m_floats[2] +
                 fVar6 * local_48.m_el[1].m_floats[0] + local_48.m_el[1].m_floats[1] * fVar1;
  auVar4._0_4_ = fVar2 * local_48.m_el[0].m_floats[2] +
                 fVar6 * local_48.m_el[0].m_floats[0] + local_48.m_el[0].m_floats[1] * fVar1;
  auVar4._8_4_ = fVar2 * local_48.m_el[2].m_floats[2] +
                 fVar6 * local_48.m_el[2].m_floats[0] + fVar1 * local_48.m_el[2].m_floats[1];
  auVar4._12_4_ = 0;
  *(undefined1 (*) [16])clampedLocalNormal->m_floats = auVar4;
  return true;
}

Assistant:

bool	btClampNormal(const btVector3& edge,const btVector3& tri_normal_org,const btVector3& localContactNormalOnB, btScalar correctedEdgeAngle, btVector3 & clampedLocalNormal)
{
	btVector3 tri_normal = tri_normal_org;
	//we only have a local triangle normal, not a local contact normal -> only normal in world space...
	//either compute the current angle all in local space, or all in world space

	btVector3 edgeCross = edge.cross(tri_normal).normalize();
	btScalar curAngle = btGetAngle(edgeCross,tri_normal,localContactNormalOnB);

	if (correctedEdgeAngle<0)
	{
		if (curAngle < correctedEdgeAngle)
		{
			btScalar diffAngle = correctedEdgeAngle-curAngle;
			btQuaternion rotation(edge,diffAngle );
			clampedLocalNormal = btMatrix3x3(rotation)*localContactNormalOnB;
			return true;
		}
	}

	if (correctedEdgeAngle>=0)
	{
		if (curAngle > correctedEdgeAngle)
		{
			btScalar diffAngle = correctedEdgeAngle-curAngle;
			btQuaternion rotation(edge,diffAngle );
			clampedLocalNormal = btMatrix3x3(rotation)*localContactNormalOnB;
			return true;
		}
	}
	return false;
}